

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O3

void __thiscall
chrono::curiosity::Curiosity::Create
          (Curiosity *this,CuriosityChassisType chassis_type,CuriosityWheelType wheel_type)

{
  double *pdVar1;
  undefined8 uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  ChShaft *pCVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [8];
  shared_ptr<chrono::ChMaterialSurface> *__args_2;
  long lVar14;
  undefined8 *puVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  ChQuaternion<double> steer_rot;
  undefined4 local_120;
  undefined1 local_119;
  undefined8 local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_110 [2];
  ChShaft *local_100;
  ChQuaternion<double> local_f8;
  CuriosityWheelType local_cc;
  undefined1 local_c8 [8];
  undefined1 auStack_c0 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  double dStack_98;
  double local_90;
  ChMatrix33<double> local_88;
  shared_ptr<chrono::ChMaterialSurface> *local_40;
  CuriosityChassisType local_34;
  
  local_40 = &this->m_default_material;
  local_c8 = (undefined1  [8])0x0;
  local_cc = wheel_type;
  local_34 = chassis_type;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::curiosity::CuriosityChassis,std::allocator<chrono::curiosity::CuriosityChassis>,char_const(&)[8],chrono::curiosity::CuriosityChassisType&,std::shared_ptr<chrono::ChMaterialSurface>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_c0,(CuriosityChassis **)local_c8,
             (allocator<chrono::curiosity::CuriosityChassis> *)&local_f8,(char (*) [8])0x1697e4,
             &local_34,local_40);
  auVar13 = local_c8;
  uVar2 = auStack_c0._0_8_;
  local_c8 = (undefined1  [8])0x0;
  auVar4._24_8_ = 0;
  auVar4._0_24_ = auStack_c0._8_24_;
  auStack_c0 = auVar4 << 0x40;
  p_Var3 = (this->m_chassis).
           super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_chassis).
  super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)auVar13;
  (this->m_chassis).
  super___shared_ptr<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_c0._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_c0._0_8_);
    }
  }
  puVar15 = (undefined8 *)(wheel_pos + 0x10);
  lVar14 = 0;
  local_100 = (ChShaft *)&PTR__ChFrame_0017db90;
  do {
    uVar2 = *puVar15;
    auVar16._8_8_ = uVar2;
    auVar16._0_8_ = uVar2;
    auVar16._16_8_ = uVar2;
    auVar16._24_8_ = uVar2;
    local_c8 = (undefined1  [8])local_100;
    auVar4 = vblendps_avx(ZEXT1632(*(undefined1 (*) [16])(puVar15 + -2)),auVar16,0x30);
    auVar31._8_8_ = QUNIT;
    auVar31._0_8_ = QUNIT;
    auVar31._16_8_ = QUNIT;
    auVar31._24_8_ = QUNIT;
    auStack_c0 = vblendps_avx(auVar4,auVar31,0xc0);
    local_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_ChLinkMotorRotationSpeed;
    dStack_98 = _ChBody;
    local_90 = _ComputeMassProperties;
    ChMatrix33<double>::ChMatrix33(&local_88,(ChQuaternion<double> *)&QUNIT);
    local_f8.m_data[0] = 0.0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::curiosity::CuriosityWheel,std::allocator<chrono::curiosity::CuriosityWheel>,char_const(&)[6],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::curiosity::CuriosityWheelType&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8.m_data + 1),
               (CuriosityWheel **)&local_f8,
               (allocator<chrono::curiosity::CuriosityWheel> *)&local_118,(char (*) [6])0x169816,
               (ChFrame<double> *)local_c8,&this->m_wheel_material,&local_cc);
    dVar12 = local_f8.m_data[1];
    dVar11 = local_f8.m_data[0];
    local_f8.m_data[0] = 0.0;
    local_f8.m_data[1] = 0.0;
    p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&(this->m_wheels)._M_elems[0].
                      super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi + lVar14);
    pdVar1 = (double *)
             ((long)&(this->m_wheels)._M_elems[0].
                     super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr + lVar14);
    *pdVar1 = dVar11;
    pdVar1[1] = dVar12;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_data[1] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_data[1]);
      }
    }
    puVar15 = puVar15 + 3;
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x60);
  chrono::Q_from_AngZ(3.141592653589793);
  pCVar10 = local_100;
  auVar17._8_8_ = _UpdateForces;
  auVar17._0_8_ = _UpdateForces;
  auVar17._16_8_ = _UpdateForces;
  auVar17._24_8_ = _UpdateForces;
  local_c8 = (undefined1  [8])local_100;
  auVar4 = vblendps_avx(ZEXT1632(_VNULL),auVar17,0x30);
  auVar32._8_8_ = local_f8.m_data[0];
  auVar32._0_8_ = local_f8.m_data[0];
  auVar32._16_8_ = local_f8.m_data[0];
  auVar32._24_8_ = local_f8.m_data[0];
  auStack_c0 = vblendps_avx(auVar4,auVar32,0xc0);
  local_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_data[1];
  dStack_98 = local_f8.m_data[2];
  local_90 = local_f8.m_data[3];
  ChMatrix33<double>::ChMatrix33(&local_88,&local_f8);
  ChFrame<double>::operator=
            (&(((this->m_wheels)._M_elems[1].
                super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_CuriosityPart).m_mesh_xform,(ChFrame<double> *)local_c8);
  chrono::Q_from_AngZ(3.141592653589793);
  auVar18._8_8_ = _UpdateForces;
  auVar18._0_8_ = _UpdateForces;
  auVar18._16_8_ = _UpdateForces;
  auVar18._24_8_ = _UpdateForces;
  local_c8 = (undefined1  [8])pCVar10;
  auVar4 = vblendps_avx(ZEXT1632(_VNULL),auVar18,0x30);
  auVar33._8_8_ = local_f8.m_data[0];
  auVar33._0_8_ = local_f8.m_data[0];
  auVar33._16_8_ = local_f8.m_data[0];
  auVar33._24_8_ = local_f8.m_data[0];
  auStack_c0 = vblendps_avx(auVar4,auVar33,0xc0);
  local_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_data[1];
  dStack_98 = local_f8.m_data[2];
  local_90 = local_f8.m_data[3];
  ChMatrix33<double>::ChMatrix33(&local_88,&local_f8);
  ChFrame<double>::operator=
            (&(((this->m_wheels)._M_elems[3].
                super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_CuriosityPart).m_mesh_xform,(ChFrame<double> *)local_c8);
  chrono::Q_from_AngZ(3.141592653589793);
  auVar19._8_8_ = _UpdateForces;
  auVar19._0_8_ = _UpdateForces;
  auVar19._16_8_ = _UpdateForces;
  auVar19._24_8_ = _UpdateForces;
  local_c8 = (undefined1  [8])pCVar10;
  auVar4 = vblendps_avx(ZEXT1632(_VNULL),auVar19,0x30);
  auVar34._8_8_ = local_f8.m_data[0];
  auVar34._0_8_ = local_f8.m_data[0];
  auVar34._16_8_ = local_f8.m_data[0];
  auVar34._24_8_ = local_f8.m_data[0];
  auStack_c0 = vblendps_avx(auVar4,auVar34,0xc0);
  local_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_data[1];
  dStack_98 = local_f8.m_data[2];
  local_90 = local_f8.m_data[3];
  ChMatrix33<double>::ChMatrix33(&local_88,&local_f8);
  ChFrame<double>::operator=
            (&(((this->m_wheels)._M_elems[5].
                super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_CuriosityPart).m_mesh_xform,(ChFrame<double> *)local_c8);
  auVar20._8_8_ = cr_rel_pos_lf._16_8_;
  auVar20._0_8_ = cr_rel_pos_lf._16_8_;
  auVar20._16_8_ = cr_rel_pos_lf._16_8_;
  auVar20._24_8_ = cr_rel_pos_lf._16_8_;
  local_c8 = (undefined1  [8])pCVar10;
  auVar4 = vblendps_avx(ZEXT1632(cr_rel_pos_lf._0_16_),auVar20,0x30);
  auVar35._8_8_ = QUNIT;
  auVar35._0_8_ = QUNIT;
  auVar35._16_8_ = QUNIT;
  auVar35._24_8_ = QUNIT;
  auStack_c0 = vblendps_avx(auVar4,auVar35,0xc0);
  local_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_ChLinkMotorRotationSpeed;
  dStack_98 = _ChBody;
  local_90 = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_88,(ChQuaternion<double> *)&QUNIT);
  __args_2 = local_40;
  local_f8.m_data[0] = 0.0;
  local_118 = (CuriosityUpright *)((ulong)local_118._4_4_ << 0x20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::curiosity::CuriosityRocker,std::allocator<chrono::curiosity::CuriosityRocker>,char_const(&)[9],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8.m_data + 1),
             (CuriosityRocker **)&local_f8,
             (allocator<chrono::curiosity::CuriosityRocker> *)&local_120,(char (*) [9])"rocker_L",
             (ChFrame<double> *)local_c8,local_40,(int *)&local_118);
  dVar12 = local_f8.m_data[1];
  dVar11 = local_f8.m_data[0];
  local_f8.m_data[0] = 0.0;
  local_f8.m_data[1] = 0.0;
  p_Var3 = (this->m_rockers)._M_elems[0].
           super___shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_rockers)._M_elems[0].
  super___shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)dVar11;
  (this->m_rockers)._M_elems[0].
  super___shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar12;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_data[1] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_data[1]);
    }
  }
  auVar21._8_8_ = cr_rel_pos_rf._16_8_;
  auVar21._0_8_ = cr_rel_pos_rf._16_8_;
  auVar21._16_8_ = cr_rel_pos_rf._16_8_;
  auVar21._24_8_ = cr_rel_pos_rf._16_8_;
  local_c8 = (undefined1  [8])local_100;
  auVar4 = vblendps_avx(ZEXT1632(cr_rel_pos_rf._0_16_),auVar21,0x30);
  auVar36._8_8_ = QUNIT;
  auVar36._0_8_ = QUNIT;
  auVar36._16_8_ = QUNIT;
  auVar36._24_8_ = QUNIT;
  auStack_c0 = vblendps_avx(auVar4,auVar36,0xc0);
  local_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_ChLinkMotorRotationSpeed;
  dStack_98 = _ChBody;
  local_90 = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_88,(ChQuaternion<double> *)&QUNIT);
  local_118 = (CuriosityUpright *)CONCAT44(local_118._4_4_,1);
  local_f8.m_data[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::curiosity::CuriosityRocker,std::allocator<chrono::curiosity::CuriosityRocker>,char_const(&)[9],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8.m_data + 1),
             (CuriosityRocker **)&local_f8,
             (allocator<chrono::curiosity::CuriosityRocker> *)&local_120,(char (*) [9])"rocker_R",
             (ChFrame<double> *)local_c8,__args_2,(int *)&local_118);
  dVar12 = local_f8.m_data[1];
  dVar11 = local_f8.m_data[0];
  local_f8.m_data[0] = 0.0;
  local_f8.m_data[1] = 0.0;
  p_Var3 = (this->m_rockers)._M_elems[1].
           super___shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_rockers)._M_elems[1].
  super___shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)dVar11;
  (this->m_rockers)._M_elems[1].
  super___shared_ptr<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar12;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_data[1] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_data[1]);
    }
  }
  auVar22._8_8_ = cr_rel_pos_lb._16_8_;
  auVar22._0_8_ = cr_rel_pos_lb._16_8_;
  auVar22._16_8_ = cr_rel_pos_lb._16_8_;
  auVar22._24_8_ = cr_rel_pos_lb._16_8_;
  local_c8 = (undefined1  [8])local_100;
  auVar4 = vblendps_avx(ZEXT1632(cr_rel_pos_lb._0_16_),auVar22,0x30);
  auVar37._8_8_ = QUNIT;
  auVar37._0_8_ = QUNIT;
  auVar37._16_8_ = QUNIT;
  auVar37._24_8_ = QUNIT;
  auStack_c0 = vblendps_avx(auVar4,auVar37,0xc0);
  local_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_ChLinkMotorRotationSpeed;
  dStack_98 = _ChBody;
  local_90 = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_88,(ChQuaternion<double> *)&QUNIT);
  local_118 = (CuriosityUpright *)((ulong)local_118 & 0xffffffff00000000);
  local_f8.m_data[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::curiosity::CuriosityBogie,std::allocator<chrono::curiosity::CuriosityBogie>,char_const(&)[8],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8.m_data + 1),
             (CuriosityBogie **)&local_f8,(allocator<chrono::curiosity::CuriosityBogie> *)&local_120
             ,(char (*) [8])"bogie_L",(ChFrame<double> *)local_c8,__args_2,(int *)&local_118);
  dVar12 = local_f8.m_data[1];
  dVar11 = local_f8.m_data[0];
  local_f8.m_data[0] = 0.0;
  local_f8.m_data[1] = 0.0;
  p_Var3 = (this->m_bogies)._M_elems[0].
           super___shared_ptr<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_bogies)._M_elems[0].
  super___shared_ptr<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)dVar11;
  (this->m_bogies)._M_elems[0].
  super___shared_ptr<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar12;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_data[1] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_data[1]);
    }
  }
  auVar23._8_8_ = cr_rel_pos_rb._16_8_;
  auVar23._0_8_ = cr_rel_pos_rb._16_8_;
  auVar23._16_8_ = cr_rel_pos_rb._16_8_;
  auVar23._24_8_ = cr_rel_pos_rb._16_8_;
  local_c8 = (undefined1  [8])local_100;
  auVar4 = vblendps_avx(ZEXT1632(cr_rel_pos_rb._0_16_),auVar23,0x30);
  auVar38._8_8_ = QUNIT;
  auVar38._0_8_ = QUNIT;
  auVar38._16_8_ = QUNIT;
  auVar38._24_8_ = QUNIT;
  auStack_c0 = vblendps_avx(auVar4,auVar38,0xc0);
  local_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_ChLinkMotorRotationSpeed;
  dStack_98 = _ChBody;
  local_90 = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_88,(ChQuaternion<double> *)&QUNIT);
  local_118 = (CuriosityUpright *)CONCAT44(local_118._4_4_,1);
  local_f8.m_data[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::curiosity::CuriosityBogie,std::allocator<chrono::curiosity::CuriosityBogie>,char_const(&)[8],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f8.m_data + 1),
             (CuriosityBogie **)&local_f8,(allocator<chrono::curiosity::CuriosityBogie> *)&local_120
             ,(char (*) [8])"bogie_R",(ChFrame<double> *)local_c8,__args_2,(int *)&local_118);
  dVar12 = local_f8.m_data[1];
  dVar11 = local_f8.m_data[0];
  local_f8.m_data[0] = 0.0;
  local_f8.m_data[1] = 0.0;
  p_Var3 = (this->m_bogies)._M_elems[1].
           super___shared_ptr<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_bogies)._M_elems[1].
  super___shared_ptr<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)dVar11;
  (this->m_bogies)._M_elems[1].
  super___shared_ptr<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar12;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_data[1] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_data[1]);
    }
  }
  local_c8 = (undefined1  [8])0x0;
  auStack_c0._0_16_ = ZEXT816(0x400921fb54442d18) << 0x40;
  chrono::Q_from_Euler123((ChVector *)&local_f8);
  auVar24._8_8_ = sr_rel_pos_lf._16_8_;
  auVar24._0_8_ = sr_rel_pos_lf._16_8_;
  auVar24._16_8_ = sr_rel_pos_lf._16_8_;
  auVar24._24_8_ = sr_rel_pos_lf._16_8_;
  local_c8 = (undefined1  [8])local_100;
  auVar4 = vblendps_avx(ZEXT1632(sr_rel_pos_lf._0_16_),auVar24,0x30);
  auVar39._8_8_ = QUNIT;
  auVar39._0_8_ = QUNIT;
  auVar39._16_8_ = QUNIT;
  auVar39._24_8_ = QUNIT;
  auStack_c0 = vblendps_avx(auVar4,auVar39,0xc0);
  local_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_ChLinkMotorRotationSpeed;
  dStack_98 = _ChBody;
  local_90 = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_88,(ChQuaternion<double> *)&QUNIT);
  local_118 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::curiosity::CuriosityUpright,std::allocator<chrono::curiosity::CuriosityUpright>,char_const(&)[11],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&>
            (a_Stack_110,(CuriosityUpright **)&local_118,
             (allocator<chrono::curiosity::CuriosityUpright> *)&local_120,
             (char (*) [11])"upright_FL",(ChFrame<double> *)local_c8,__args_2);
  _Var9._M_pi = a_Stack_110[0]._M_pi;
  peVar6 = local_118;
  local_118 = (CuriosityUpright *)0x0;
  a_Stack_110[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (this->m_rocker_uprights)._M_elems[0].
           super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_rocker_uprights)._M_elems[0].
  super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar6;
  (this->m_rocker_uprights)._M_elems[0].
  super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var9._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if (a_Stack_110[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_110[0]._M_pi);
    }
  }
  auVar25._8_8_ = DAT_00183500;
  auVar25._0_8_ = DAT_00183500;
  auVar25._16_8_ = DAT_00183500;
  auVar25._24_8_ = DAT_00183500;
  local_c8 = (undefined1  [8])local_100;
  auVar4 = vblendps_avx(ZEXT1632(_sr_rel_pos_rf),auVar25,0x30);
  auVar40._8_8_ = local_f8.m_data[0];
  auVar40._0_8_ = local_f8.m_data[0];
  auVar40._16_8_ = local_f8.m_data[0];
  auVar40._24_8_ = local_f8.m_data[0];
  auStack_c0 = vblendps_avx(auVar4,auVar40,0xc0);
  local_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_data[1];
  dStack_98 = local_f8.m_data[2];
  local_90 = local_f8.m_data[3];
  ChMatrix33<double>::ChMatrix33(&local_88,&local_f8);
  local_118 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::curiosity::CuriosityUpright,std::allocator<chrono::curiosity::CuriosityUpright>,char_const(&)[11],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&>
            (a_Stack_110,(CuriosityUpright **)&local_118,
             (allocator<chrono::curiosity::CuriosityUpright> *)&local_120,
             (char (*) [11])"upright_FR",(ChFrame<double> *)local_c8,__args_2);
  _Var9._M_pi = a_Stack_110[0]._M_pi;
  peVar6 = local_118;
  local_118 = (CuriosityUpright *)0x0;
  a_Stack_110[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (this->m_rocker_uprights)._M_elems[1].
           super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_rocker_uprights)._M_elems[1].
  super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar6;
  (this->m_rocker_uprights)._M_elems[1].
  super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var9._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if (a_Stack_110[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_110[0]._M_pi);
    }
  }
  auVar26._8_8_ = sr_rel_pos_lb._16_8_;
  auVar26._0_8_ = sr_rel_pos_lb._16_8_;
  auVar26._16_8_ = sr_rel_pos_lb._16_8_;
  auVar26._24_8_ = sr_rel_pos_lb._16_8_;
  local_c8 = (undefined1  [8])local_100;
  auVar4 = vblendps_avx(ZEXT1632(sr_rel_pos_lb._0_16_),auVar26,0x30);
  auVar41._8_8_ = QUNIT;
  auVar41._0_8_ = QUNIT;
  auVar41._16_8_ = QUNIT;
  auVar41._24_8_ = QUNIT;
  auStack_c0 = vblendps_avx(auVar4,auVar41,0xc0);
  local_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_ChLinkMotorRotationSpeed;
  dStack_98 = _ChBody;
  local_90 = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_88,(ChQuaternion<double> *)&QUNIT);
  local_118 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::curiosity::CuriosityUpright,std::allocator<chrono::curiosity::CuriosityUpright>,char_const(&)[11],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&>
            (a_Stack_110,(CuriosityUpright **)&local_118,
             (allocator<chrono::curiosity::CuriosityUpright> *)&local_120,
             (char (*) [11])"upright_RL",(ChFrame<double> *)local_c8,__args_2);
  _Var9._M_pi = a_Stack_110[0]._M_pi;
  peVar6 = local_118;
  local_118 = (CuriosityUpright *)0x0;
  a_Stack_110[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (this->m_bogie_uprights)._M_elems[0].
           super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_bogie_uprights)._M_elems[0].
  super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar6;
  (this->m_bogie_uprights)._M_elems[0].
  super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var9._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if (a_Stack_110[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_110[0]._M_pi);
    }
  }
  auVar27._8_8_ = DAT_00183540;
  auVar27._0_8_ = DAT_00183540;
  auVar27._16_8_ = DAT_00183540;
  auVar27._24_8_ = DAT_00183540;
  local_c8 = (undefined1  [8])local_100;
  auVar4 = vblendps_avx(ZEXT1632(_sr_rel_pos_rb),auVar27,0x30);
  auVar42._8_8_ = local_f8.m_data[0];
  auVar42._0_8_ = local_f8.m_data[0];
  auVar42._16_8_ = local_f8.m_data[0];
  auVar42._24_8_ = local_f8.m_data[0];
  auStack_c0 = vblendps_avx(auVar4,auVar42,0xc0);
  local_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_data[1];
  dStack_98 = local_f8.m_data[2];
  local_90 = local_f8.m_data[3];
  ChMatrix33<double>::ChMatrix33(&local_88,&local_f8);
  local_118 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::curiosity::CuriosityUpright,std::allocator<chrono::curiosity::CuriosityUpright>,char_const(&)[11],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&>
            (a_Stack_110,(CuriosityUpright **)&local_118,
             (allocator<chrono::curiosity::CuriosityUpright> *)&local_120,
             (char (*) [11])"upright_RR",(ChFrame<double> *)local_c8,__args_2);
  _Var9._M_pi = a_Stack_110[0]._M_pi;
  peVar6 = local_118;
  local_118 = (CuriosityUpright *)0x0;
  a_Stack_110[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (this->m_bogie_uprights)._M_elems[1].
           super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_bogie_uprights)._M_elems[1].
  super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar6;
  (this->m_bogie_uprights)._M_elems[1].
  super___shared_ptr<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var9._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if (a_Stack_110[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_110[0]._M_pi);
    }
  }
  auVar28._8_8_ = DAT_00183620;
  auVar28._0_8_ = DAT_00183620;
  auVar28._16_8_ = DAT_00183620;
  auVar28._24_8_ = DAT_00183620;
  local_c8 = (undefined1  [8])local_100;
  auVar4 = vblendps_avx(ZEXT1632(_tr_rel_pos_t),auVar28,0x30);
  auVar43._8_8_ = QUNIT;
  auVar43._0_8_ = QUNIT;
  auVar43._16_8_ = QUNIT;
  auVar43._24_8_ = QUNIT;
  auStack_c0 = vblendps_avx(auVar4,auVar43,0xc0);
  local_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_ChLinkMotorRotationSpeed;
  dStack_98 = _ChBody;
  local_90 = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_88,(ChQuaternion<double> *)&QUNIT);
  local_118 = (CuriosityUpright *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::curiosity::CuriosityDifferentialBar,std::allocator<chrono::curiosity::CuriosityDifferentialBar>,char_const(&)[9],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&>
            (a_Stack_110,(CuriosityDifferentialBar **)&local_118,
             (allocator<chrono::curiosity::CuriosityDifferentialBar> *)&local_120,
             (char (*) [9])"diff bar",(ChFrame<double> *)local_c8,__args_2);
  _Var9._M_pi = a_Stack_110[0]._M_pi;
  peVar7 = (element_type *)local_118;
  local_118 = (CuriosityUpright *)0x0;
  a_Stack_110[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (this->m_diff_bar).
           super___shared_ptr<chrono::curiosity::CuriosityDifferentialBar,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->m_diff_bar).
  super___shared_ptr<chrono::curiosity::CuriosityDifferentialBar,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar7;
  (this->m_diff_bar).
  super___shared_ptr<chrono::curiosity::CuriosityDifferentialBar,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var9._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if (a_Stack_110[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_110[0]._M_pi);
    }
  }
  auVar29._8_8_ = tr_rel_pos_l._16_8_;
  auVar29._0_8_ = tr_rel_pos_l._16_8_;
  auVar29._16_8_ = tr_rel_pos_l._16_8_;
  auVar29._24_8_ = tr_rel_pos_l._16_8_;
  local_c8 = (undefined1  [8])local_100;
  auVar4 = vblendps_avx(ZEXT1632(tr_rel_pos_l._0_16_),auVar29,0x30);
  auVar44._8_8_ = QUNIT;
  auVar44._0_8_ = QUNIT;
  auVar44._16_8_ = QUNIT;
  auVar44._24_8_ = QUNIT;
  auStack_c0 = vblendps_avx(auVar4,auVar44,0xc0);
  local_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_ChLinkMotorRotationSpeed;
  dStack_98 = _ChBody;
  local_90 = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_88,(ChQuaternion<double> *)&QUNIT);
  local_120 = 0;
  local_118 = (CuriosityUpright *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::curiosity::CuriosityDifferentialLink,std::allocator<chrono::curiosity::CuriosityDifferentialLink>,char_const(&)[12],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
            (a_Stack_110,(CuriosityDifferentialLink **)&local_118,
             (allocator<chrono::curiosity::CuriosityDifferentialLink> *)&local_119,
             (char (*) [12])"diff link L",(ChFrame<double> *)local_c8,__args_2,(int *)&local_120);
  _Var9._M_pi = a_Stack_110[0]._M_pi;
  peVar8 = (element_type *)local_118;
  local_118 = (CuriosityUpright *)0x0;
  a_Stack_110[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (this->m_diff_links)._M_elems[0].
           super___shared_ptr<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->m_diff_links)._M_elems[0].
  super___shared_ptr<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar8;
  (this->m_diff_links)._M_elems[0].
  super___shared_ptr<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var9._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if (a_Stack_110[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_110[0]._M_pi);
    }
  }
  auVar30._8_8_ = tr_rel_pos_r._16_8_;
  auVar30._0_8_ = tr_rel_pos_r._16_8_;
  auVar30._16_8_ = tr_rel_pos_r._16_8_;
  auVar30._24_8_ = tr_rel_pos_r._16_8_;
  local_c8 = (undefined1  [8])local_100;
  auVar4 = vblendps_avx(ZEXT1632(tr_rel_pos_r._0_16_),auVar30,0x30);
  auVar45._8_8_ = QUNIT;
  auVar45._0_8_ = QUNIT;
  auVar45._16_8_ = QUNIT;
  auVar45._24_8_ = QUNIT;
  auStack_c0 = vblendps_avx(auVar4,auVar45,0xc0);
  local_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_ChLinkMotorRotationSpeed;
  dStack_98 = _ChBody;
  local_90 = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_88,(ChQuaternion<double> *)&QUNIT);
  local_120 = 1;
  local_118 = (CuriosityUpright *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::curiosity::CuriosityDifferentialLink,std::allocator<chrono::curiosity::CuriosityDifferentialLink>,char_const(&)[12],chrono::ChFrame<double>,std::shared_ptr<chrono::ChMaterialSurface>&,int>
            (a_Stack_110,(CuriosityDifferentialLink **)&local_118,
             (allocator<chrono::curiosity::CuriosityDifferentialLink> *)&local_119,
             (char (*) [12])"diff link R",(ChFrame<double> *)local_c8,__args_2,(int *)&local_120);
  _Var9._M_pi = a_Stack_110[0]._M_pi;
  peVar8 = (element_type *)local_118;
  local_118 = (CuriosityUpright *)0x0;
  a_Stack_110[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (this->m_diff_links)._M_elems[1].
           super___shared_ptr<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->m_diff_links)._M_elems[1].
  super___shared_ptr<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar8;
  (this->m_diff_links)._M_elems[1].
  super___shared_ptr<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var9._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if (a_Stack_110[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_110[0]._M_pi);
    }
  }
  lVar14 = 0;
  do {
    local_c8 = (undefined1  [8])0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChShaft,std::allocator<chrono::ChShaft>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_c0,(ChShaft **)local_c8,
               (allocator<chrono::ChShaft> *)&local_118);
    auVar13 = local_c8;
    uVar2 = auStack_c0._0_8_;
    local_c8 = (undefined1  [8])0x0;
    auVar5._24_8_ = 0;
    auVar5._0_24_ = auStack_c0._8_24_;
    auStack_c0 = auVar5 << 0x40;
    p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&(this->m_drive_shafts)._M_elems[0].
                      super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi + lVar14);
    puVar15 = (undefined8 *)
              ((long)&(this->m_drive_shafts)._M_elems[0].
                      super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
              lVar14);
    *puVar15 = auVar13;
    puVar15[1] = uVar2;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_c0._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_c0._0_8_);
      }
    }
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x60);
  return;
}

Assistant:

void Curiosity::Create(CuriosityChassisType chassis_type, CuriosityWheelType wheel_type) {
    // create rover chassis
    ChQuaternion<> body_rot;
    m_chassis = chrono_types::make_shared<CuriosityChassis>("chassis", chassis_type, m_default_material);

    // Create 6 Curiosity Rover wheels
    for (int i = 0; i < 6; i++) {
        m_wheels[i] = chrono_types::make_shared<CuriosityWheel>("wheel", ChFrame<>(wheel_pos[i], QUNIT),
                                                                m_wheel_material, wheel_type);
    }
    m_wheels[C_RF]->m_mesh_xform = ChFrame<>(VNULL, Q_from_AngZ(CH_C_PI));
    m_wheels[C_RM]->m_mesh_xform = ChFrame<>(VNULL, Q_from_AngZ(CH_C_PI));
    m_wheels[C_RB]->m_mesh_xform = ChFrame<>(VNULL, Q_from_AngZ(CH_C_PI));

    // Create Curiosity suspension rockers and bogies
    m_rockers[0] = chrono_types::make_shared<CuriosityRocker>(  //
        "rocker_L", ChFrame<>(cr_rel_pos_lf, QUNIT), m_default_material, 0);
    m_rockers[1] = chrono_types::make_shared<CuriosityRocker>(  //
        "rocker_R", ChFrame<>(cr_rel_pos_rf, QUNIT), m_default_material, 1);

    m_bogies[0] = chrono_types::make_shared<CuriosityBogie>(  //
        "bogie_L", ChFrame<>(cr_rel_pos_lb, QUNIT), m_default_material, 0);
    m_bogies[1] = chrono_types::make_shared<CuriosityBogie>(  //
        "bogie_R", ChFrame<>(cr_rel_pos_rb, QUNIT), m_default_material, 1);

    // Create the steering uprights
    ChQuaternion<> steer_rot = Q_from_Euler123(ChVector<double>(0, 0, CH_C_PI));

    m_rocker_uprights[0] = chrono_types::make_shared<CuriosityUpright>(  //
        "upright_FL", ChFrame<>(sr_rel_pos_lf, QUNIT), m_default_material);
    m_rocker_uprights[1] = chrono_types::make_shared<CuriosityUpright>(  //
        "upright_FR", ChFrame<>(sr_rel_pos_rf, steer_rot), m_default_material);

    m_bogie_uprights[0] = chrono_types::make_shared<CuriosityUpright>(  //
        "upright_RL", ChFrame<>(sr_rel_pos_lb, QUNIT), m_default_material);
    m_bogie_uprights[1] = chrono_types::make_shared<CuriosityUpright>(  //
        "upright_RR", ChFrame<>(sr_rel_pos_rb, steer_rot), m_default_material);

    // Create the differential components
    m_diff_bar = chrono_types::make_shared<CuriosityDifferentialBar>(  //
        "diff bar", ChFrame<>(tr_rel_pos_t, QUNIT), m_default_material);
    m_diff_links[0] = chrono_types::make_shared<CuriosityDifferentialLink>(  //
        "diff link L", ChFrame<>(tr_rel_pos_l, QUNIT), m_default_material, 0);
    m_diff_links[1] = chrono_types::make_shared<CuriosityDifferentialLink>(  //
        "diff link R", ChFrame<>(tr_rel_pos_r, QUNIT), m_default_material, 1);

    // Create drive shafts
    for (int i = 0; i < 6; i++) {
        m_drive_shafts[i] = chrono_types::make_shared<ChShaft>();
    }
}